

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.cpp
# Opt level: O3

void __thiscall
Js::PropertyDescriptor::MergeFrom(PropertyDescriptor *this,PropertyDescriptor *descriptor)

{
  void *pvVar1;
  
  if (descriptor->configurableSpecified == true) {
    this->Configurable = descriptor->Configurable;
    this->configurableSpecified = true;
  }
  if (descriptor->enumerableSpecified == true) {
    this->Enumerable = descriptor->Enumerable;
    this->enumerableSpecified = true;
  }
  if (descriptor->writableSpecified == true) {
    this->Writable = descriptor->Writable;
    this->writableSpecified = true;
  }
  if (descriptor->valueSpecified == true) {
    pvVar1 = (descriptor->Value).ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->Value).ptr = pvVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    this->valueSpecified = true;
  }
  if (descriptor->getterSpecified == true) {
    pvVar1 = (descriptor->Getter).ptr;
    Memory::Recycler::WBSetBit((char *)&this->Getter);
    (this->Getter).ptr = pvVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Getter);
    this->getterSpecified = true;
  }
  if (descriptor->setterSpecified == true) {
    pvVar1 = (descriptor->Setter).ptr;
    Memory::Recycler::WBSetBit((char *)&this->Setter);
    (this->Setter).ptr = pvVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->Setter);
    this->setterSpecified = true;
  }
  return;
}

Assistant:

void PropertyDescriptor::MergeFrom(const PropertyDescriptor& descriptor)
    {
        if (descriptor.configurableSpecified)
        {
            this->SetConfigurable(descriptor.Configurable);
        }
        if (descriptor.enumerableSpecified)
        {
            this->SetEnumerable(descriptor.Enumerable);
        }
        if (descriptor.writableSpecified)
        {
            this->SetWritable(descriptor.Writable);
        }

        if (descriptor.valueSpecified)
        {
            this->SetValue(descriptor.Value);
        }
        if (descriptor.getterSpecified)
        {
            this->SetGetter(descriptor.Getter);
        }
        if (descriptor.setterSpecified)
        {
            this->SetSetter(descriptor.Setter);
        }
    }